

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

Stream * rw::ps2::writeNativeData(Stream *stream,int32 len,void *object,int32 param_4,int32 param_5)

{
  long lVar1;
  long lVar2;
  bool32 bVar3;
  undefined8 in_RAX;
  long lVar4;
  ulong uVar5;
  uint32 buf [2];
  undefined8 local_38;
  
  local_38 = in_RAX;
  writeChunkHeader(stream,1,len + -0xc);
  if ((*(int **)((long)object + 0x98) != (int *)0x0) && (**(int **)((long)object + 0x98) == 4)) {
    Stream::writeU32(stream,4);
    lVar1 = *(long *)((long)object + 0x98);
    if (*(int *)(lVar1 + 4) != 0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        lVar2 = *(long *)(lVar1 + 8);
        local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)(lVar2 + lVar4));
        bVar3 = unfixDmaOffsets((InstanceData *)(lVar4 + lVar2));
        local_38 = CONCAT44(bVar3,(undefined4)local_38);
        Stream::write32(stream,&local_38,8);
        (*stream->_vptr_Stream[3])
                  (stream,*(undefined8 *)(lVar2 + 0x10 + lVar4),(ulong)*(uint *)(lVar2 + lVar4));
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar5 < *(uint *)(lVar1 + 4));
    }
  }
  return stream;
}

Assistant:

Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	writeChunkHeader(stream, ID_STRUCT, len-12);
	if(geometry->instData == nil ||
	   geometry->instData->platform != PLATFORM_PS2)
		return stream;
	stream->writeU32(PLATFORM_PS2);
	InstanceDataHeader *header = (InstanceDataHeader*)geometry->instData;
	for(uint32 i = 0; i < header->numMeshes; i++){
		InstanceData *instance = &header->instanceMeshes[i];
		uint32 buf[2];
		buf[0] = instance->dataSize;
		buf[1] = unfixDmaOffsets(instance);
		stream->write32(buf, 8);
		stream->write8(instance->data, instance->dataSize);
#ifdef RW_PS2
		if(!buf[1])
			fixDmaOffsets(instance);
#endif
	}
	return stream;
}